

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

string * __thiscall
ctemplate::TemplateDictionary::CreateSubdictName_abi_cxx11_
          (string *__return_storage_ptr__,TemplateDictionary *this,TemplateString *dict_name,
          TemplateString *sub_name,size_t index,char *suffix)

{
  undefined8 *puVar1;
  _func_int **pp_Var2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  char index_str [64];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  char local_78 [72];
  
  snprintf(local_78,0x40,"%lu");
  pp_Var2 = (this->super_TemplateDictionaryInterface)._vptr_TemplateDictionaryInterface;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,pp_Var2,
             (long)pp_Var2 + (long)((this->arena_->super_BaseArena).first_blocks_ + -5) + 8);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_98);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_e8 = *puVar6;
    uStack_e0 = (undefined4)plVar4[3];
    uStack_dc = *(undefined4 *)((long)plVar4 + 0x1c);
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar6;
    local_f8 = (ulong *)*plVar4;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,dict_name->ptr_,dict_name->ptr_ + dict_name->length_);
  uVar9 = 0xf;
  if (local_f8 != &local_e8) {
    uVar9 = local_e8;
  }
  if (uVar9 < (ulong)(local_130 + local_f0)) {
    uVar9 = 0xf;
    if (local_138 != local_128) {
      uVar9 = local_128[0];
    }
    if ((ulong)(local_130 + local_f0) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_f8);
      goto LAB_00124e01;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_138);
LAB_00124e01:
  local_118 = &local_108;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_108 = *puVar1;
    uStack_100 = puVar5[3];
  }
  else {
    local_108 = *puVar1;
    local_118 = (undefined8 *)*puVar5;
  }
  local_110 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c8 = *plVar7;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar7;
    local_d8 = (long *)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a8 = *plVar7;
    lStack_a0 = plVar4[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar7;
    local_b8 = (long *)*plVar4;
  }
  local_b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string TemplateDictionary::CreateSubdictName(
    const TemplateString& dict_name, const TemplateString& sub_name,
    size_t index, const char* suffix) {
  char index_str[64];
  snprintf(index_str, sizeof(index_str), "%" PRIuS, index);
  return (PrintableTemplateString(dict_name) + "/" +
          PrintableTemplateString(sub_name) + "#" + index_str + suffix);
}